

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Node::moveRight(Node *this)

{
  int iVar1;
  uint uVar2;
  Node *this_00;
  Node *local_50;
  Node *child;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> temp;
  
  uVar2 = findZero(this);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,&this->puzzle);
  if ((8 < uVar2) || ((0x124U >> (uVar2 & 0x1f) & 1) == 0)) {
    iVar1 = *(pointer)((long)local_30 + (long)(int)uVar2 * 4);
    *(int *)((long)local_30 + (long)(int)uVar2 * 4) =
         *(pointer)((long)local_30 + ((long)(int)uVar2 + 1) * 4);
    *(int *)((long)local_30 + ((long)(int)uVar2 + 1) * 4) = iVar1;
  }
  this_00 = (Node *)operator_new(0x38);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&child,
             (vector<int,_std::allocator<int>_> *)local_30);
  Node(this_00,(vector<int,_std::allocator<int>_> *)&child,this);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&child);
  local_50 = this_00;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->children,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void Node::moveRight() {
  int zPos = findZero();
  vector<int> temp = puzzle;
  if (zPos != 2 && zPos != 5 && zPos != 8)
    std::swap(temp[zPos], temp[zPos + 1]);
  Node* child = new Node(temp, this);
  children.push_back(child);
}